

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.h
# Opt level: O1

Own<kj::(anonymous_namespace)::InMemoryDirectory> __thiscall
kj::atomicRefcounted<kj::(anonymous_namespace)::InMemoryDirectory,kj::Clock_const&>
          (kj *this,Clock *params)

{
  int iVar1;
  undefined8 *puVar2;
  undefined4 extraout_var;
  InMemoryDirectory *extraout_RDX;
  AtomicRefcounted *refcounted;
  Own<kj::(anonymous_namespace)::InMemoryDirectory> OVar3;
  
  puVar2 = (undefined8 *)operator_new(0x70);
  *(undefined4 *)(puVar2 + 2) = 0;
  *puVar2 = &PTR_getFd_0046ba68;
  puVar2[1] = &DAT_0046bb40;
  _::Mutex::Mutex((Mutex *)(puVar2 + 3));
  puVar2[6] = params;
  *(undefined4 *)(puVar2 + 8) = 0;
  puVar2[9] = 0;
  puVar2[10] = puVar2 + 8;
  puVar2[0xb] = puVar2 + 8;
  puVar2[0xc] = 0;
  iVar1 = (**params->_vptr_Clock)(params);
  puVar2[0xd] = CONCAT44(extraout_var,iVar1);
  LOCK();
  *(int *)(puVar2 + 2) = *(int *)(puVar2 + 2) + 1;
  UNLOCK();
  *(undefined8 **)this = puVar2 + 1;
  *(undefined8 **)(this + 8) = puVar2;
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

inline kj::Own<T> atomicRefcounted(Params&&... params) {
  return AtomicRefcounted::addRefInternal(new T(kj::fwd<Params>(params)...));
}